

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall PlanTest::TestPoolWithDepthOne(PlanTest *this,char *test_case)

{
  Test *pTVar1;
  int iVar2;
  char *input;
  bool bVar3;
  int iVar4;
  Node *pNVar5;
  Edge *pEVar6;
  reference ppNVar7;
  string *psVar8;
  Edge *pEVar9;
  Edge *edge;
  string local_f0;
  undefined4 local_d0;
  allocator<char> local_c9;
  string local_c8;
  undefined1 local_a8 [8];
  string err;
  string local_80;
  allocator<char> local_49;
  string local_48;
  ManifestParserOptions local_24;
  int local_1c;
  char *pcStack_18;
  int fail_count;
  char *test_case_local;
  PlanTest *this_local;
  
  pcStack_18 = test_case;
  test_case_local = (char *)this;
  local_1c = testing::Test::AssertionFailures(g_current_test);
  input = pcStack_18;
  ManifestParserOptions::ManifestParserOptions(&local_24);
  AssertParse(&(this->super_StateTestWithBuiltinRules).state_,input,local_24);
  iVar2 = local_1c;
  iVar4 = testing::Test::AssertionFailures(g_current_test);
  if (iVar2 == iVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"out1",&local_49);
    pNVar5 = StateTestWithBuiltinRules::GetNode(&this->super_StateTestWithBuiltinRules,&local_48);
    Node::MarkDirty(pNVar5);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"out2",(allocator<char> *)(err.field_2._M_local_buf + 0xf));
    pNVar5 = StateTestWithBuiltinRules::GetNode(&this->super_StateTestWithBuiltinRules,&local_80);
    Node::MarkDirty(pNVar5);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)(err.field_2._M_local_buf + 0xf));
    std::__cxx11::string::string((string *)local_a8);
    pTVar1 = g_current_test;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"out1",&local_c9);
    pNVar5 = StateTestWithBuiltinRules::GetNode(&this->super_StateTestWithBuiltinRules,&local_c8);
    bVar3 = Plan::AddTarget(&this->plan_,pNVar5,(string *)local_a8);
    testing::Test::Check
              (pTVar1,bVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
               ,0xcd,"plan_.AddTarget(GetNode(\"out1\"), &err)");
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    pTVar1 = g_current_test;
    bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_a8);
    bVar3 = testing::Test::Check
                      (pTVar1,bVar3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                       ,0xce,"\"\" == err");
    pTVar1 = g_current_test;
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"out2",(allocator<char> *)((long)&edge + 7));
      pNVar5 = StateTestWithBuiltinRules::GetNode(&this->super_StateTestWithBuiltinRules,&local_f0);
      bVar3 = Plan::AddTarget(&this->plan_,pNVar5,(string *)local_a8);
      testing::Test::Check
                (pTVar1,bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                 ,0xcf,"plan_.AddTarget(GetNode(\"out2\"), &err)");
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&edge + 7));
      pTVar1 = g_current_test;
      bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_a8);
      bVar3 = testing::Test::Check
                        (pTVar1,bVar3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                         ,0xd0,"\"\" == err");
      pTVar1 = g_current_test;
      if (bVar3) {
        bVar3 = Plan::more_to_do(&this->plan_);
        bVar3 = testing::Test::Check
                          (pTVar1,bVar3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                           ,0xd1,"plan_.more_to_do()");
        if (bVar3) {
          pEVar6 = Plan::FindWork(&this->plan_);
          bVar3 = testing::Test::Check
                            (g_current_test,pEVar6 != (Edge *)0x0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                             ,0xd4,"edge");
          pTVar1 = g_current_test;
          if (bVar3) {
            ppNVar7 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[](&pEVar6->inputs_,0);
            psVar8 = Node::path_abi_cxx11_(*ppNVar7);
            bVar3 = std::operator==("in",psVar8);
            bVar3 = testing::Test::Check
                              (pTVar1,bVar3,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                               ,0xd5,"\"in\" == edge->inputs_[0]->path()");
            pTVar1 = g_current_test;
            if (bVar3) {
              ppNVar7 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                                  (&pEVar6->outputs_,0);
              psVar8 = Node::path_abi_cxx11_(*ppNVar7);
              bVar3 = std::operator==("out1",psVar8);
              bVar3 = testing::Test::Check
                                (pTVar1,bVar3,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                 ,0xd6,"\"out1\" == edge->outputs_[0]->path()");
              pTVar1 = g_current_test;
              if (bVar3) {
                pEVar9 = Plan::FindWork(&this->plan_);
                bVar3 = testing::Test::Check
                                  (pTVar1,pEVar9 == (Edge *)0x0,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                   ,0xd9,"plan_.FindWork()");
                if (bVar3) {
                  Plan::EdgeFinished(&this->plan_,pEVar6,kEdgeSucceeded,(string *)local_a8);
                  pTVar1 = g_current_test;
                  bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_a8);
                  bVar3 = testing::Test::Check
                                    (pTVar1,bVar3,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                     ,0xdc,"\"\" == err");
                  if (bVar3) {
                    pEVar6 = Plan::FindWork(&this->plan_);
                    bVar3 = testing::Test::Check
                                      (g_current_test,pEVar6 != (Edge *)0x0,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                       ,0xdf,"edge");
                    pTVar1 = g_current_test;
                    if (bVar3) {
                      ppNVar7 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                                          (&pEVar6->inputs_,0);
                      psVar8 = Node::path_abi_cxx11_(*ppNVar7);
                      bVar3 = std::operator==("in",psVar8);
                      bVar3 = testing::Test::Check
                                        (pTVar1,bVar3,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                         ,0xe0,"\"in\" == edge->inputs_[0]->path()");
                      pTVar1 = g_current_test;
                      if (bVar3) {
                        ppNVar7 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                                            (&pEVar6->outputs_,0);
                        psVar8 = Node::path_abi_cxx11_(*ppNVar7);
                        bVar3 = std::operator==("out2",psVar8);
                        bVar3 = testing::Test::Check
                                          (pTVar1,bVar3,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                           ,0xe1,"\"out2\" == edge->outputs_[0]->path()");
                        pTVar1 = g_current_test;
                        if (bVar3) {
                          pEVar9 = Plan::FindWork(&this->plan_);
                          bVar3 = testing::Test::Check
                                            (pTVar1,pEVar9 == (Edge *)0x0,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                             ,0xe3,"plan_.FindWork()");
                          if (bVar3) {
                            Plan::EdgeFinished(&this->plan_,pEVar6,kEdgeSucceeded,(string *)local_a8
                                              );
                            pTVar1 = g_current_test;
                            bVar3 = std::operator==("",(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_a8);
                            bVar3 = testing::Test::Check
                                              (pTVar1,bVar3,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                               ,0xe6,"\"\" == err");
                            pTVar1 = g_current_test;
                            if (bVar3) {
                              bVar3 = Plan::more_to_do(&this->plan_);
                              bVar3 = testing::Test::Check
                                                (pTVar1,(bool)(~bVar3 & 1),
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                                 ,0xe8,"plan_.more_to_do()");
                              if (bVar3) {
                                pEVar6 = Plan::FindWork(&this->plan_);
                                bVar3 = testing::Test::Check
                                                  (g_current_test,pEVar6 == (Edge *)0x0,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build_test.cc"
                                                  ,0xea,"0 == edge");
                                if (bVar3) {
                                  local_d0 = 0;
                                }
                                else {
                                  testing::Test::AddAssertionFailure(g_current_test);
                                  local_d0 = 1;
                                }
                              }
                              else {
                                testing::Test::AddAssertionFailure(g_current_test);
                                local_d0 = 1;
                              }
                            }
                            else {
                              testing::Test::AddAssertionFailure(g_current_test);
                              local_d0 = 1;
                            }
                          }
                          else {
                            testing::Test::AddAssertionFailure(g_current_test);
                            local_d0 = 1;
                          }
                        }
                        else {
                          testing::Test::AddAssertionFailure(g_current_test);
                          local_d0 = 1;
                        }
                      }
                      else {
                        testing::Test::AddAssertionFailure(g_current_test);
                        local_d0 = 1;
                      }
                    }
                    else {
                      testing::Test::AddAssertionFailure(g_current_test);
                      local_d0 = 1;
                    }
                  }
                  else {
                    testing::Test::AddAssertionFailure(g_current_test);
                    local_d0 = 1;
                  }
                }
                else {
                  testing::Test::AddAssertionFailure(g_current_test);
                  local_d0 = 1;
                }
              }
              else {
                testing::Test::AddAssertionFailure(g_current_test);
                local_d0 = 1;
              }
            }
            else {
              testing::Test::AddAssertionFailure(g_current_test);
              local_d0 = 1;
            }
          }
          else {
            testing::Test::AddAssertionFailure(g_current_test);
            local_d0 = 1;
          }
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
          local_d0 = 1;
        }
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        local_d0 = 1;
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      local_d0 = 1;
    }
    std::__cxx11::string::~string((string *)local_a8);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

void PlanTest::TestPoolWithDepthOne(const char* test_case) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_, test_case));
  GetNode("out1")->MarkDirty();
  GetNode("out2")->MarkDirty();
  string err;
  EXPECT_TRUE(plan_.AddTarget(GetNode("out1"), &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(plan_.AddTarget(GetNode("out2"), &err));
  ASSERT_EQ("", err);
  ASSERT_TRUE(plan_.more_to_do());

  Edge* edge = plan_.FindWork();
  ASSERT_TRUE(edge);
  ASSERT_EQ("in",  edge->inputs_[0]->path());
  ASSERT_EQ("out1", edge->outputs_[0]->path());

  // This will be false since poolcat is serialized
  ASSERT_FALSE(plan_.FindWork());

  plan_.EdgeFinished(edge, Plan::kEdgeSucceeded, &err);
  ASSERT_EQ("", err);

  edge = plan_.FindWork();
  ASSERT_TRUE(edge);
  ASSERT_EQ("in", edge->inputs_[0]->path());
  ASSERT_EQ("out2", edge->outputs_[0]->path());

  ASSERT_FALSE(plan_.FindWork());

  plan_.EdgeFinished(edge, Plan::kEdgeSucceeded, &err);
  ASSERT_EQ("", err);

  ASSERT_FALSE(plan_.more_to_do());
  edge = plan_.FindWork();
  ASSERT_EQ(0, edge);
}